

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fgets(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  io_private *pDev_00;
  char *pcVar2;
  jx9_int64 jVar3;
  char *local_68;
  jx9_int64 local_50;
  jx9_int64 nLen;
  jx9_int64 n;
  io_private *pDev;
  char *zLine;
  jx9_io_stream *pStream;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  pStream = (jx9_io_stream *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) {
    jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
    jx9_result_bool(pjStack_18,0);
  }
  else {
    pDev_00 = (io_private *)jx9_value_to_resource((jx9_value *)pStream->zName);
    pCtx_00 = pjStack_18;
    if ((pDev_00 == (io_private *)0x0) || (pDev_00->iMagic != 0xfeac14)) {
      jx9_context_throw_error(pjStack_18,2,"Expecting an IO handle");
      jx9_result_bool(pjStack_18,0);
    }
    else {
      zLine = (char *)pDev_00->pStream;
      if ((jx9_io_stream *)zLine == (jx9_io_stream *)0x0) {
        pcVar2 = jx9_function_name(pjStack_18);
        if (zLine == (char *)0x0) {
          local_68 = "null_stream";
        }
        else {
          local_68 = *(char **)zLine;
        }
        jx9_context_throw_error_format
                  (pCtx_00,2,
                   "IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE"
                   ,pcVar2,local_68);
        jx9_result_bool(pjStack_18,0);
      }
      else {
        local_50 = -1;
        if (1 < apArg_local._4_4_) {
          local_50 = jx9_value_to_int64(*(jx9_value **)&pStream->iVersion);
        }
        jVar3 = StreamReadLine(pDev_00,(char **)&pDev,local_50);
        if (jVar3 < 1) {
          jx9_result_bool(pjStack_18,0);
        }
        else {
          jx9_result_string(pjStack_18,(char *)pDev,(int)jVar3);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_fgets(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const jx9_io_stream *pStream;
	const char *zLine;
	io_private *pDev;
	jx9_int64 n, nLen;
	if( nArg < 1 || !jx9_value_is_resource(apArg[0]) ){
		/* Missing/Invalid arguments, return FALSE */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	pStream = pDev->pStream;
	if( pStream == 0  ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device, JX9 is returning FALSE", 
			jx9_function_name(pCtx), pStream ? pStream->zName : "null_stream"
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	nLen = -1;
	if( nArg > 1 ){
		/* Maximum data to read */
		nLen = jx9_value_to_int64(apArg[1]);
	}
	/* Perform the requested operation */
	n = StreamReadLine(pDev, &zLine, nLen);
	if( n < 1 ){
		/* EOF or IO error, return FALSE */
		jx9_result_bool(pCtx, 0);
	}else{
		/* Return the freshly extracted line */
		jx9_result_string(pCtx, zLine, (int)n);
	}
	return JX9_OK;	
}